

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

char * cram_get_ref(cram_fd *fd,int id,int start,int end)

{
  int iVar1;
  ref_entry *prVar2;
  BGZF *pBVar3;
  char *pcVar4;
  ref_entry *e;
  char *cp;
  int ostart;
  char *seq;
  ref_entry *r;
  int local_20;
  int end_local;
  int start_local;
  int id_local;
  cram_fd *fd_local;
  
  if (id == -1) {
    fd_local = (cram_fd *)0x0;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&fd->ref_lock);
    if (fd->unsorted != 0) {
      fd->shared_ref = 1;
    }
    if (id < fd->refs->nref) {
      if ((fd->refs == (refs_t *)0x0) || (fd->refs->ref_id[id] == (ref_entry *)0x0)) {
        fprintf(_stderr,"No reference found for id %d\n",(ulong)(uint)id);
        pthread_mutex_unlock((pthread_mutex_t *)&fd->ref_lock);
        fd_local = (cram_fd *)0x0;
      }
      else {
        seq = (char *)fd->refs->ref_id[id];
        if ((ref_entry *)seq == (ref_entry *)0x0) {
          fprintf(_stderr,"No reference found for id %d\n",(ulong)(uint)id);
          pthread_mutex_unlock((pthread_mutex_t *)&fd->ref_lock);
          fd_local = (cram_fd *)0x0;
        }
        else {
          pthread_mutex_lock((pthread_mutex_t *)&fd->refs->lock);
          if (((ref_entry *)seq)->length == 0) {
            iVar1 = cram_populate_ref(fd,id,(ref_entry *)seq);
            if (iVar1 == -1) {
              fprintf(_stderr,"Failed to populate reference for id %d\n",(ulong)(uint)id);
              pthread_mutex_unlock((pthread_mutex_t *)&fd->refs->lock);
              pthread_mutex_unlock((pthread_mutex_t *)&fd->ref_lock);
              return (char *)0x0;
            }
            seq = (char *)fd->refs->ref_id[id];
            if (fd->unsorted != 0) {
              cram_ref_incr_locked(fd->refs,id);
            }
          }
          r._4_4_ = end;
          if (end < 1) {
            r._4_4_ = (int)*(undefined8 *)(seq + 0x10);
          }
          if (*(long *)(seq + 0x10) <= (long)r._4_4_) {
            r._4_4_ = (int)*(undefined8 *)(seq + 0x10);
          }
          if (start < 1) {
            __assert_fail("start >= 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_io.c"
                          ,0x934,"char *cram_get_ref(cram_fd *, int, int, int)");
          }
          if (((double)*(long *)(seq + 0x10) * 0.5 <= (double)(r._4_4_ - start)) ||
             (local_20 = start, fd->shared_ref != 0)) {
            local_20 = 1;
            r._4_4_ = (int)*(undefined8 *)(seq + 0x10);
          }
          if (((fd->shared_ref == 0) && (*(long *)(seq + 0x30) == 0)) &&
             ((local_20 != 1 || ((long)r._4_4_ != *(long *)(seq + 0x10))))) {
            if (id < 0) {
              if (fd->ref_free != (char *)0x0) {
                free(fd->ref_free);
                fd->ref_free = (char *)0x0;
              }
              fd->ref = (char *)0x0;
              fd->ref_id = id;
              pthread_mutex_unlock((pthread_mutex_t *)&fd->refs->lock);
              pthread_mutex_unlock((pthread_mutex_t *)&fd->ref_lock);
              fd_local = (cram_fd *)0x0;
            }
            else {
              iVar1 = strcmp(fd->refs->fn,*(char **)(seq + 8));
              if ((iVar1 != 0) || (fd->refs->fp == (BGZF *)0x0)) {
                if ((fd->refs->fp != (BGZF *)0x0) && (iVar1 = bgzf_close(fd->refs->fp), iVar1 != 0))
                {
                  return (char *)0x0;
                }
                fd->refs->fn = *(char **)(seq + 8);
                pBVar3 = bgzf_open_ref(fd->refs->fn,"r");
                fd->refs->fp = pBVar3;
                if (pBVar3 == (BGZF *)0x0) {
                  pthread_mutex_unlock((pthread_mutex_t *)&fd->refs->lock);
                  pthread_mutex_unlock((pthread_mutex_t *)&fd->ref_lock);
                  return (char *)0x0;
                }
              }
              pcVar4 = load_ref_portion(fd->refs->fp,(ref_entry *)seq,local_20,r._4_4_);
              fd->ref = pcVar4;
              if (pcVar4 == (char *)0x0) {
                pthread_mutex_unlock((pthread_mutex_t *)&fd->refs->lock);
                pthread_mutex_unlock((pthread_mutex_t *)&fd->ref_lock);
                fd_local = (cram_fd *)0x0;
              }
              else {
                if (fd->ref_free != (char *)0x0) {
                  free(fd->ref_free);
                }
                fd->ref_id = id;
                fd->ref_start = local_20;
                fd->ref_end = r._4_4_;
                fd->ref_free = fd->ref;
                pcVar4 = fd->ref;
                pthread_mutex_unlock((pthread_mutex_t *)&fd->refs->lock);
                pthread_mutex_unlock((pthread_mutex_t *)&fd->ref_lock);
                fd_local = (cram_fd *)(pcVar4 + ((long)start - (long)local_20));
              }
            }
          }
          else {
            if (id < 0) {
              fd->ref = (char *)0x0;
              e = (ref_entry *)0x0;
            }
            else {
              if (*(long *)(seq + 0x30) == 0) {
                prVar2 = cram_ref_load(fd->refs,id);
                if (prVar2 == (ref_entry *)0x0) {
                  pthread_mutex_unlock((pthread_mutex_t *)&fd->refs->lock);
                  pthread_mutex_unlock((pthread_mutex_t *)&fd->ref_lock);
                  return (char *)0x0;
                }
                if (fd->unsorted != 0) {
                  cram_ref_incr_locked(fd->refs,id);
                }
              }
              else {
                cram_ref_incr_locked(fd->refs,id);
              }
              fd->ref = (char *)0x0;
              fd->ref_start = 1;
              fd->ref_end = (int)*(undefined8 *)(seq + 0x10);
              fd->ref_id = id;
              e = (ref_entry *)(fd->refs->ref_id[id]->seq + (long)start + -1);
            }
            pthread_mutex_unlock((pthread_mutex_t *)&fd->refs->lock);
            pthread_mutex_unlock((pthread_mutex_t *)&fd->ref_lock);
            fd_local = (cram_fd *)e;
          }
        }
      }
    }
    else {
      fprintf(_stderr,"No reference found for id %d\n",(ulong)(uint)id);
      pthread_mutex_unlock((pthread_mutex_t *)&fd->ref_lock);
      fd_local = (cram_fd *)0x0;
    }
  }
  return (char *)fd_local;
}

Assistant:

char *cram_get_ref(cram_fd *fd, int id, int start, int end) {
    ref_entry *r;
    char *seq;
    int ostart = start;

    if (id == -1)
	return NULL;

    /* FIXME: axiomatic query of r->seq being true?
     * Or shortcut for unsorted data where we load once and never free?
     */

    //fd->shared_ref = 1; // hard code for now to simplify things

    pthread_mutex_lock(&fd->ref_lock);

    RP("%d cram_get_ref on fd %p, id %d, range %d..%d\n", gettid(), fd, id, start, end);

    /*
     * Unsorted data implies we want to fetch an entire reference at a time.
     * We just deal with this at the moment by claiming we're sharing
     * references instead, which has the same requirement.
     */
    if (fd->unsorted)
	fd->shared_ref = 1;


    /* Sanity checking: does this ID exist? */
    if (id >= fd->refs->nref) {
	fprintf(stderr, "No reference found for id %d\n", id);
	pthread_mutex_unlock(&fd->ref_lock);
	return NULL;
    }

    if (!fd->refs || !fd->refs->ref_id[id]) {
	fprintf(stderr, "No reference found for id %d\n", id);
	pthread_mutex_unlock(&fd->ref_lock);
	return NULL;
    }

    if (!(r = fd->refs->ref_id[id])) {
	fprintf(stderr, "No reference found for id %d\n", id);
	pthread_mutex_unlock(&fd->ref_lock);
	return NULL;
    }


    /*
     * It has an entry, but may not have been populated yet.
     * Any manually loaded .fai files have their lengths known.
     * A ref entry computed from @SQ lines (M5 or UR field) will have
     * r->length == 0 unless it's been loaded once and verified that we have
     * an on-disk filename for it.
     *
     * 19 Sep 2013: Moved the lock here as the cram_populate_ref code calls
     * open_path_mfile and libcurl, which isn't multi-thread safe unless I
     * rewrite my code to have one curl handle per thread.
     */
    pthread_mutex_lock(&fd->refs->lock);
    if (r->length == 0) {
	if (cram_populate_ref(fd, id, r) == -1) {
	    fprintf(stderr, "Failed to populate reference for id %d\n", id);
	    pthread_mutex_unlock(&fd->refs->lock);
	    pthread_mutex_unlock(&fd->ref_lock);
	    return NULL;
	}
	r = fd->refs->ref_id[id];
	if (fd->unsorted)
	    cram_ref_incr_locked(fd->refs, id);
    }


    /*
     * We now know that we the filename containing the reference, so check
     * for limits. If it's over half the reference we'll load all of it in
     * memory as this will speed up subsequent calls.
     */
    if (end < 1)
	end = r->length;
    if (end >= r->length)
	end  = r->length; 
    assert(start >= 1);

    if (end - start >= 0.5*r->length || fd->shared_ref) {
	start = 1;
	end = r->length;
    }
    
    /*
     * Maybe we have it cached already? If so use it.
     *
     * Alternatively if we don't have the sequence but we're sharing
     * references and/or are asking for the entire length of it, then
     * load the full reference into the refs structure and return
     * a pointer to that one instead.
     */
    if (fd->shared_ref || r->seq || (start == 1 && end == r->length)) {
	char *cp;

	if (id >= 0) {
	    if (r->seq) {
		cram_ref_incr_locked(fd->refs, id);
	    } else {
		ref_entry *e;
		if (!(e = cram_ref_load(fd->refs, id))) {
		    pthread_mutex_unlock(&fd->refs->lock);
		    pthread_mutex_unlock(&fd->ref_lock);
		    return NULL;
		}

		/* unsorted data implies cache ref indefinitely, to avoid
		 * continually loading and unloading.
		 */
		if (fd->unsorted)
		    cram_ref_incr_locked(fd->refs, id);
	    }	    

	    fd->ref = NULL; /* We never access it directly */
	    fd->ref_start = 1;
	    fd->ref_end   = r->length;
	    fd->ref_id    = id;

	    cp = fd->refs->ref_id[id]->seq + ostart-1;
	} else {
	    fd->ref = NULL;
	    cp = NULL;
	}

	RP("%d cram_get_ref returning for id %d, count %d\n", gettid(), id, (int)r->count);

	pthread_mutex_unlock(&fd->refs->lock);
	pthread_mutex_unlock(&fd->ref_lock);
	return cp;
    }

    /*
     * Otherwise we're not sharing, we don't have a copy of it already and
     * we're only asking for a small portion of it.
     *
     * In this case load up just that segment ourselves, freeing any old
     * small segments in the process.
     */

    /* Unmapped ref ID */
    if (id < 0) {
	if (fd->ref_free) {
	    free(fd->ref_free);
	    fd->ref_free = NULL;
	}
	fd->ref = NULL;
	fd->ref_id = id;
	pthread_mutex_unlock(&fd->refs->lock);
	pthread_mutex_unlock(&fd->ref_lock);
	return NULL;
    }

    /* Open file if it's not already the current open reference */
    if (strcmp(fd->refs->fn, r->fn) || fd->refs->fp == NULL) {
	if (fd->refs->fp)
	    if (bgzf_close(fd->refs->fp) != 0)
		return NULL;
	fd->refs->fn = r->fn;
	if (!(fd->refs->fp = bgzf_open_ref(fd->refs->fn, "r"))) {
	    pthread_mutex_unlock(&fd->refs->lock);
	    pthread_mutex_unlock(&fd->ref_lock);
	    return NULL;
	}
    }

    if (!(fd->ref = load_ref_portion(fd->refs->fp, r, start, end))) {
	pthread_mutex_unlock(&fd->refs->lock);
	pthread_mutex_unlock(&fd->ref_lock);
	return NULL;
    }

    if (fd->ref_free)
	free(fd->ref_free);

    fd->ref_id    = id;
    fd->ref_start = start;
    fd->ref_end   = end;
    fd->ref_free = fd->ref;
    seq = fd->ref;

    pthread_mutex_unlock(&fd->refs->lock);
    pthread_mutex_unlock(&fd->ref_lock);

    return seq + ostart - start;
}